

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * CTcPrsOpUnary::parse_dec(int pre,CTcPrsNode *subexpr)

{
  int iVar1;
  char *pcVar2;
  long *in_RSI;
  int in_EDI;
  CTcPrsNode *in_stack_ffffffffffffffc8;
  CTPNPostDec *in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  iVar1 = (**(code **)(*in_RSI + 0x18))();
  if (iVar1 == 0) {
    pcVar2 = CTcTokenizer::get_op_text(TOKT_DEC);
    CTcTokenizer::log_error(0x2afe,pcVar2);
  }
  if (in_EDI == 0) {
    local_8 = (CTPNPreDec *)CTcPrsAllocObj::operator_new(0x2a9de3);
    CTPNPostDec::CTPNPostDec(in_stack_ffffffffffffffd0,(CTcPrsNode *)local_8);
  }
  else {
    local_8 = (CTPNPreDec *)CTcPrsAllocObj::operator_new(0x2a9d97);
    CTPNPreDec::CTPNPreDec(local_8,in_stack_ffffffffffffffc8);
  }
  return (CTcPrsNode *)local_8;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_dec(int pre, CTcPrsNode *subexpr)
{
    /* require an lvalue */
    if (!subexpr->check_lvalue())
    {
        /* log an error, but continue parsing */
        G_tok->log_error(TCERR_INVALID_UNARY_LVALUE,
                         G_tok->get_op_text(TOKT_DEC));
    }

    /* apply the pre-increment operator */
    if (pre)
        return new CTPNPreDec(subexpr);
    else
        return new CTPNPostDec(subexpr);
}